

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

int FnNoise5_float(float *array,long nx,long ny,int nullcheck,float nullvalue,long *ngood,
                  float *minval,float *maxval,double *noise2,double *noise3,double *noise5,
                  int *status)

{
  bool bVar1;
  bool bVar2;
  float *pfVar3;
  float *arr;
  float *arr_00;
  float *arr_01;
  double *__base;
  double *__base_00;
  double *__base_01;
  long lVar4;
  int n;
  float fVar5;
  double local_f8;
  double xnoise5;
  double xnoise3;
  double xnoise2;
  double *diffs5;
  double *diffs3;
  double *diffs2;
  int do_range;
  float xmaxval;
  float xminval;
  float v9;
  float v8;
  float v7;
  float v6;
  float v5;
  float v4;
  float v3;
  float v2;
  float v1;
  float *rowpix;
  float *differences5;
  float *differences3;
  float *differences2;
  long ngoodpix;
  long nvals2;
  long nvals;
  long nrows2;
  long nrows;
  long jj;
  long ii;
  float *minval_local;
  long *ngood_local;
  float nullvalue_local;
  int nullcheck_local;
  long ny_local;
  long nx_local;
  float *array_local;
  
  nrows2 = 0;
  nvals = 0;
  differences2 = (float *)0x0;
  do_range = 0x7f7fffff;
  diffs2._4_4_ = -3.4028235e+38;
  bVar2 = false;
  _nullvalue_local = ny;
  ny_local = nx;
  if (nx < 9) {
    ny_local = nx * ny;
    _nullvalue_local = 1;
  }
  if (ny_local < 9) {
    for (jj = 0; jj < ny_local; jj = jj + 1) {
      if (((nullcheck == 0) || (array[jj] != nullvalue)) || (NAN(array[jj]) || NAN(nullvalue))) {
        if (array[jj] < (float)do_range) {
          do_range = (int)array[jj];
        }
        if (diffs2._4_4_ < array[jj]) {
          diffs2._4_4_ = array[jj];
        }
        differences2 = (float *)((long)differences2 + 1);
      }
    }
    if (minval != (float *)0x0) {
      *minval = (float)do_range;
    }
    if (maxval != (float *)0x0) {
      *maxval = diffs2._4_4_;
    }
    if (ngood != (long *)0x0) {
      *ngood = (long)differences2;
    }
    if (noise2 != (double *)0x0) {
      *noise2 = 0.0;
    }
    if (noise3 != (double *)0x0) {
      *noise3 = 0.0;
    }
    if (noise5 != (double *)0x0) {
      *noise5 = 0.0;
    }
    array_local._4_4_ = *status;
  }
  else {
    if ((minval != (float *)0x0) || (maxval != (float *)0x0)) {
      bVar2 = true;
    }
    arr = (float *)calloc(ny_local,4);
    if (arr == (float *)0x0) {
      *status = 0x71;
      array_local._4_4_ = *status;
    }
    else {
      arr_00 = (float *)calloc(ny_local,4);
      if (arr_00 == (float *)0x0) {
        free(arr);
        *status = 0x71;
        array_local._4_4_ = *status;
      }
      else {
        arr_01 = (float *)calloc(ny_local,4);
        if (arr_01 == (float *)0x0) {
          free(arr);
          free(arr_00);
          *status = 0x71;
          array_local._4_4_ = *status;
        }
        else {
          __base = (double *)calloc(_nullvalue_local,8);
          if (__base == (double *)0x0) {
            free(arr);
            free(arr_00);
            free(arr_01);
            *status = 0x71;
            array_local._4_4_ = *status;
          }
          else {
            __base_00 = (double *)calloc(_nullvalue_local,8);
            if (__base_00 == (double *)0x0) {
              free(arr);
              free(arr_00);
              free(arr_01);
              free(__base);
              *status = 0x71;
              array_local._4_4_ = *status;
            }
            else {
              __base_01 = (double *)calloc(_nullvalue_local,8);
              if (__base_01 == (double *)0x0) {
                free(arr);
                free(arr_00);
                free(arr_01);
                free(__base);
                free(__base_00);
                *status = 0x71;
                array_local._4_4_ = *status;
              }
              else {
                for (nrows = 0; nrows < (long)_nullvalue_local; nrows = nrows + 1) {
                  lVar4 = nrows * ny_local;
                  jj = 0;
                  if (nullcheck != 0) {
                    while( true ) {
                      bVar1 = false;
                      if (jj < ny_local) {
                        bVar1 = array[lVar4 + jj] == nullvalue;
                      }
                      if (!bVar1) break;
                      jj = jj + 1;
                    }
                  }
                  pfVar3 = differences2;
                  if (jj != ny_local) {
                    v3 = array[lVar4 + jj];
                    if (bVar2) {
                      if (v3 < (float)do_range) {
                        do_range = (int)v3;
                      }
                      if (diffs2._4_4_ < v3) {
                        diffs2._4_4_ = v3;
                      }
                    }
                    jj = jj + 1;
                    if (nullcheck != 0) {
                      while( true ) {
                        bVar1 = false;
                        if (jj < ny_local) {
                          bVar1 = array[lVar4 + jj] == nullvalue;
                        }
                        if (!bVar1) break;
                        jj = jj + 1;
                      }
                    }
                    pfVar3 = (float *)((long)differences2 + 1);
                    if (jj != ny_local) {
                      v4 = array[lVar4 + jj];
                      if (bVar2) {
                        if (v4 < (float)do_range) {
                          do_range = (int)v4;
                        }
                        if (diffs2._4_4_ < v4) {
                          diffs2._4_4_ = v4;
                        }
                      }
                      jj = jj + 1;
                      if (nullcheck != 0) {
                        while( true ) {
                          bVar1 = false;
                          if (jj < ny_local) {
                            bVar1 = array[lVar4 + jj] == nullvalue;
                          }
                          if (!bVar1) break;
                          jj = jj + 1;
                        }
                      }
                      pfVar3 = (float *)((long)differences2 + 2);
                      if (jj != ny_local) {
                        v5 = array[lVar4 + jj];
                        if (bVar2) {
                          if (v5 < (float)do_range) {
                            do_range = (int)v5;
                          }
                          if (diffs2._4_4_ < v5) {
                            diffs2._4_4_ = v5;
                          }
                        }
                        jj = jj + 1;
                        if (nullcheck != 0) {
                          while( true ) {
                            bVar1 = false;
                            if (jj < ny_local) {
                              bVar1 = array[lVar4 + jj] == nullvalue;
                            }
                            if (!bVar1) break;
                            jj = jj + 1;
                          }
                        }
                        pfVar3 = (float *)((long)differences2 + 3);
                        if (jj != ny_local) {
                          v6 = array[lVar4 + jj];
                          if (bVar2) {
                            if (v6 < (float)do_range) {
                              do_range = (int)v6;
                            }
                            if (diffs2._4_4_ < v6) {
                              diffs2._4_4_ = v6;
                            }
                          }
                          jj = jj + 1;
                          if (nullcheck != 0) {
                            while( true ) {
                              bVar1 = false;
                              if (jj < ny_local) {
                                bVar1 = array[lVar4 + jj] == nullvalue;
                              }
                              if (!bVar1) break;
                              jj = jj + 1;
                            }
                          }
                          pfVar3 = differences2 + 1;
                          if (jj != ny_local) {
                            v7 = array[lVar4 + jj];
                            if (bVar2) {
                              if (v7 < (float)do_range) {
                                do_range = (int)v7;
                              }
                              if (diffs2._4_4_ < v7) {
                                diffs2._4_4_ = v7;
                              }
                            }
                            jj = jj + 1;
                            if (nullcheck != 0) {
                              while( true ) {
                                bVar1 = false;
                                if (jj < ny_local) {
                                  bVar1 = array[lVar4 + jj] == nullvalue;
                                }
                                if (!bVar1) break;
                                jj = jj + 1;
                              }
                            }
                            pfVar3 = (float *)((long)differences2 + 5);
                            if (jj != ny_local) {
                              v8 = array[lVar4 + jj];
                              if (bVar2) {
                                if (v8 < (float)do_range) {
                                  do_range = (int)v8;
                                }
                                if (diffs2._4_4_ < v8) {
                                  diffs2._4_4_ = v8;
                                }
                              }
                              jj = jj + 1;
                              if (nullcheck != 0) {
                                while( true ) {
                                  bVar1 = false;
                                  if (jj < ny_local) {
                                    bVar1 = array[lVar4 + jj] == nullvalue;
                                  }
                                  if (!bVar1) break;
                                  jj = jj + 1;
                                }
                              }
                              pfVar3 = (float *)((long)differences2 + 6);
                              if (jj != ny_local) {
                                v9 = array[lVar4 + jj];
                                if (bVar2) {
                                  if (v9 < (float)do_range) {
                                    do_range = (int)v9;
                                  }
                                  if (diffs2._4_4_ < v9) {
                                    diffs2._4_4_ = v9;
                                  }
                                }
                                jj = jj + 1;
                                if (nullcheck != 0) {
                                  while( true ) {
                                    bVar1 = false;
                                    if (jj < ny_local) {
                                      bVar1 = array[lVar4 + jj] == nullvalue;
                                    }
                                    if (!bVar1) break;
                                    jj = jj + 1;
                                  }
                                }
                                pfVar3 = (float *)((long)differences2 + 7);
                                if (jj != ny_local) {
                                  xminval = array[lVar4 + jj];
                                  differences2 = differences2 + 2;
                                  if (bVar2) {
                                    if (xminval < (float)do_range) {
                                      do_range = (int)xminval;
                                    }
                                    if (diffs2._4_4_ < xminval) {
                                      diffs2._4_4_ = xminval;
                                    }
                                  }
                                  nvals2 = 0;
                                  ngoodpix = 0;
                                  while (jj = jj + 1, jj < ny_local) {
                                    if (nullcheck != 0) {
                                      while( true ) {
                                        bVar1 = false;
                                        if (jj < ny_local) {
                                          bVar1 = array[lVar4 + jj] == nullvalue;
                                        }
                                        if (!bVar1) break;
                                        jj = jj + 1;
                                      }
                                    }
                                    if (jj == ny_local) break;
                                    fVar5 = array[lVar4 + jj];
                                    if (bVar2) {
                                      if (fVar5 < (float)do_range) {
                                        do_range = (int)fVar5;
                                      }
                                      if (diffs2._4_4_ < fVar5) {
                                        diffs2._4_4_ = fVar5;
                                      }
                                    }
                                    if (((v7 != v8) || (v8 != v9)) || (NAN(v8) || NAN(v9))) {
                                      arr[ngoodpix] =
                                           (float)(double)((ulong)(double)(v7 - v9) &
                                                          (ulong)DAT_00293a60);
                                      ngoodpix = ngoodpix + 1;
                                    }
                                    if (((v5 != v6) || (v6 != v7)) ||
                                       ((v7 != v8 || ((v8 != v9 || (NAN(v8) || NAN(v9))))))) {
                                      arr_00[nvals2] = ABS((v7 + v7 + -v5) - v9);
                                      arr_01[nvals2] =
                                           (float)(double)((ulong)(double)(v9 * -4.0 +
                                                                           v7 * 6.0 + -(v5 * 4.0) +
                                                                           v3 + fVar5) &
                                                          (ulong)DAT_00293a60);
                                      nvals2 = nvals2 + 1;
                                    }
                                    else {
                                      differences2 = (float *)((long)differences2 + 1);
                                    }
                                    v3 = v4;
                                    v4 = v5;
                                    v5 = v6;
                                    v6 = v7;
                                    v7 = v8;
                                    v8 = v9;
                                    v9 = xminval;
                                    xminval = fVar5;
                                  }
                                  pfVar3 = (float *)(nvals2 + (long)differences2);
                                  if (nvals2 != 0) {
                                    if (nvals2 == 1) {
                                      if (ngoodpix == 1) {
                                        __base[nvals] = (double)*arr;
                                        nvals = nvals + 1;
                                      }
                                      __base_00[nrows2] = (double)*arr_00;
                                      __base_01[nrows2] = (double)*arr_01;
                                    }
                                    else {
                                      n = (int)nvals2;
                                      if (1 < ngoodpix) {
                                        fVar5 = quick_select_float(arr,n);
                                        __base[nvals] = (double)fVar5;
                                        nvals = nvals + 1;
                                      }
                                      fVar5 = quick_select_float(arr_00,n);
                                      __base_00[nrows2] = (double)fVar5;
                                      fVar5 = quick_select_float(arr_01,n);
                                      __base_01[nrows2] = (double)fVar5;
                                    }
                                    nrows2 = nrows2 + 1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  differences2 = pfVar3;
                }
                if (nrows2 == 0) {
                  xnoise5 = 0.0;
                  local_f8 = 0.0;
                }
                else if (nrows2 == 1) {
                  xnoise5 = *__base_00;
                  local_f8 = *__base_01;
                }
                else {
                  qsort(__base_00,nrows2,8,FnCompare_double);
                  qsort(__base_01,nrows2,8,FnCompare_double);
                  xnoise5 = (__base_00[(nrows2 + -1) / 2] + __base_00[nrows2 / 2]) / 2.0;
                  local_f8 = (__base_01[(nrows2 + -1) / 2] + __base_01[nrows2 / 2]) / 2.0;
                }
                if (nvals == 0) {
                  xnoise3 = 0.0;
                }
                else if (nvals == 1) {
                  xnoise3 = *__base;
                }
                else {
                  qsort(__base,nvals,8,FnCompare_double);
                  xnoise3 = (__base[(nvals + -1) / 2] + __base[nvals / 2]) / 2.0;
                }
                if (ngood != (long *)0x0) {
                  *ngood = (long)differences2;
                }
                if (minval != (float *)0x0) {
                  *minval = (float)do_range;
                }
                if (maxval != (float *)0x0) {
                  *maxval = diffs2._4_4_;
                }
                if (noise2 != (double *)0x0) {
                  *noise2 = xnoise3 * 1.0483579;
                }
                if (noise3 != (double *)0x0) {
                  *noise3 = xnoise5 * 0.6052697;
                }
                if (noise5 != (double *)0x0) {
                  *noise5 = local_f8 * 0.1772048;
                }
                free(__base_01);
                free(__base_00);
                free(__base);
                free(arr_01);
                free(arr_00);
                free(arr);
                array_local._4_4_ = *status;
              }
            }
          }
        }
      }
    }
  }
  return array_local._4_4_;
}

Assistant:

static int FnNoise5_float
       (float *array,       /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
        long ny,            /* number of rows in the image */
	int nullcheck,      /* check for null values, if true */
	float nullvalue,    /* value of null pixels, if nullcheck is true */
   /* returned parameters */   
	long *ngood,        /* number of good, non-null pixels? */
	float *minval,    /* minimum non-null value */
	float *maxval,    /* maximum non-null value */
	double *noise2,      /* returned 2nd order MAD of all non-null pixels */
	double *noise3,      /* returned 3rd order MAD of all non-null pixels */
	double *noise5,      /* returned 5th order MAD of all non-null pixels */
	int *status)        /* error status */

/*
Estimate the median and background noise in the input image using 2nd, 3rd and 5th
order Median Absolute Differences.

The noise in the background of the image is calculated using the MAD algorithms 
developed for deriving the signal to noise ratio in spectra
(see issue #42 of the ST-ECF newsletter, http://www.stecf.org/documents/newsletter/)

3rd order:  noise = 1.482602 / sqrt(6) * median (abs(2*flux(i) - flux(i-2) - flux(i+2)))

The returned estimates are the median of the values that are computed for each 
row of the image.
*/
{
	long ii, jj, nrows = 0, nrows2 = 0, nvals, nvals2, ngoodpix = 0;
	float *differences2, *differences3, *differences5;
	float *rowpix, v1, v2, v3, v4, v5, v6, v7, v8, v9;
	float xminval = FLT_MAX, xmaxval = -FLT_MAX;
	int do_range = 0;
	double *diffs2, *diffs3, *diffs5; 
	double xnoise2 = 0, xnoise3 = 0, xnoise5 = 0;
	
	if (nx < 9) {
		/* treat entire array as an image with a single row */
		nx = nx * ny;
		ny = 1;
	}

	/* rows must have at least 9 pixels */
	if (nx < 9) {

		for (ii = 0; ii < nx; ii++) {
		    if (nullcheck && array[ii] == nullvalue)
		        continue;
		    else {
			if (array[ii] < xminval) xminval = array[ii];
			if (array[ii] > xmaxval) xmaxval = array[ii];
			ngoodpix++;
		    }
		}
		if (minval) *minval = xminval;
		if (maxval) *maxval = xmaxval;
		if (ngood) *ngood = ngoodpix;
		if (noise2) *noise2 = 0.;
		if (noise3) *noise3 = 0.;
		if (noise5) *noise5 = 0.;
		return(*status);
	}

	/* do we need to compute the min and max value? */
	if (minval || maxval) do_range = 1;
	
        /* allocate arrays used to compute the median and noise estimates */
	differences2 = calloc(nx, sizeof(float));
	if (!differences2) {
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences3 = calloc(nx, sizeof(float));
	if (!differences3) {
		free(differences2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}
	differences5 = calloc(nx, sizeof(float));
	if (!differences5) {
		free(differences2);
		free(differences3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs2 = calloc(ny, sizeof(double));
	if (!diffs2) {
		free(differences2);
		free(differences3);
		free(differences5);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs3 = calloc(ny, sizeof(double));
	if (!diffs3) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	diffs5 = calloc(ny, sizeof(double));
	if (!diffs5) {
		free(differences2);
		free(differences3);
		free(differences5);
		free(diffs2);
		free(diffs3);
        	*status = MEMORY_ALLOCATION;
		return(*status);
	}

	/* loop over each row of the image */
	for (jj=0; jj < ny; jj++) {

                rowpix = array + (jj * nx); /* point to first pixel in the row */

		/***** find the first valid pixel in row */
		ii = 0;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v1 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v1 < xminval) xminval = v1;
			if (v1 > xmaxval) xmaxval = v1;
		}

		/***** find the 2nd valid pixel in row (which we will skip over) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v2 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;
		
		if (do_range) {
			if (v2 < xminval) xminval = v2;
			if (v2 > xmaxval) xmaxval = v2;
		}

		/***** find the 3rd valid pixel in row */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v3 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v3 < xminval) xminval = v3;
			if (v3 > xmaxval) xmaxval = v3;
		}
				
		/* find the 4nd valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v4 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v4 < xminval) xminval = v4;
			if (v4 > xmaxval) xmaxval = v4;
		}
			
		/* find the 5th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v5 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v5 < xminval) xminval = v5;
			if (v5 > xmaxval) xmaxval = v5;
		}
				
		/* find the 6th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v6 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v6 < xminval) xminval = v6;
			if (v6 > xmaxval) xmaxval = v6;
		}
				
		/* find the 7th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v7 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v7 < xminval) xminval = v7;
			if (v7 > xmaxval) xmaxval = v7;
		}
				
		/* find the 8th valid pixel in row (to be skipped) */
		ii++;
		if (nullcheck)
		    while (ii < nx && rowpix[ii] == nullvalue) ii++;

		if (ii == nx) continue;  /* hit end of row */
		v8 = rowpix[ii];  /* store the good pixel value */
		ngoodpix++;

		if (do_range) {
			if (v8 < xminval) xminval = v8;
			if (v8 > xmaxval) xmaxval = v8;
		}
		/* now populate the differences arrays */
		/* for the remaining pixels in the row */
		nvals = 0;
		nvals2 = 0;
		for (ii++; ii < nx; ii++) {

		    /* find the next valid pixel in row */
                    if (nullcheck)
		        while (ii < nx && rowpix[ii] == nullvalue) ii++;
		     
		    if (ii == nx) break;  /* hit end of row */
		    v9 = rowpix[ii];  /* store the good pixel value */

		    if (do_range) {
			if (v9 < xminval) xminval = v9;
			if (v9 > xmaxval) xmaxval = v9;
		    }

		    /* construct array of absolute differences */

		    if (!(v5 == v6 && v6 == v7) ) {
		        differences2[nvals2] = (float) fabs(v5 - v7);
			nvals2++;
		    }

		    if (!(v3 == v4 && v4 == v5 && v5 == v6 && v6 == v7) ) {
		        differences3[nvals] = (float) fabs((2 * v5) - v3 - v7);
		        differences5[nvals] = (float) fabs((6 * v5) - (4 * v3) - (4 * v7) + v1 + v9);
		        nvals++;  
		    } else {
		        /* ignore constant background regions */
			ngoodpix++;
		    }

		    /* shift over 1 pixel */
		    v1 = v2;
		    v2 = v3;
		    v3 = v4;
		    v4 = v5;
		    v5 = v6;
		    v6 = v7;
		    v7 = v8;
		    v8 = v9;
	        }  /* end of loop over pixels in the row */

		/* compute the median diffs */
		/* Note that there are 8 more pixel values than there are diffs values. */
		ngoodpix += nvals;

		if (nvals == 0) {
		    continue;  /* cannot compute medians on this row */
		} else if (nvals == 1) {
		    if (nvals2 == 1) {
		        diffs2[nrows2] = differences2[0];
			nrows2++;
		    }
		        
		    diffs3[nrows] = differences3[0];
		    diffs5[nrows] = differences5[0];
		} else {
                    /* quick_select returns the median MUCH faster than using qsort */
		    if (nvals2 > 1) {
                        diffs2[nrows2] = quick_select_float(differences2, nvals);
			nrows2++;
		    }

                    diffs3[nrows] = quick_select_float(differences3, nvals);
                    diffs5[nrows] = quick_select_float(differences5, nvals);
		}

		nrows++;
	}  /* end of loop over rows */

	    /* compute median of the values for each row */
	if (nrows == 0) { 
	       xnoise3 = 0;
	       xnoise5 = 0;
	} else if (nrows == 1) {
	       xnoise3 = diffs3[0];
	       xnoise5 = diffs5[0];
	} else {	    
	       qsort(diffs3, nrows, sizeof(double), FnCompare_double);
	       qsort(diffs5, nrows, sizeof(double), FnCompare_double);
	       xnoise3 =  (diffs3[(nrows - 1)/2] + diffs3[nrows/2]) / 2.;
	       xnoise5 =  (diffs5[(nrows - 1)/2] + diffs5[nrows/2]) / 2.;
	}

	if (nrows2 == 0) { 
	       xnoise2 = 0;
	} else if (nrows2 == 1) {
	       xnoise2 = diffs2[0];
	} else {	    
	       qsort(diffs2, nrows2, sizeof(double), FnCompare_double);
	       xnoise2 =  (diffs2[(nrows2 - 1)/2] + diffs2[nrows2/2]) / 2.;
	}

	if (ngood)  *ngood  = ngoodpix;
	if (minval) *minval = xminval;
	if (maxval) *maxval = xmaxval;
	if (noise2)  *noise2  = 1.0483579 * xnoise2;
	if (noise3)  *noise3  = 0.6052697 * xnoise3;
	if (noise5)  *noise5  = 0.1772048 * xnoise5;

	free(diffs5);
	free(diffs3);
	free(diffs2);
	free(differences5);
	free(differences3);
	free(differences2);

	return(*status);
}